

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O0

string * __thiscall
soul::PaddedStringTable::getRow_abi_cxx11_
          (string *__return_storage_ptr__,PaddedStringTable *this,size_t rowIndex)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  unsigned_long *puVar5;
  string local_68;
  ulong local_48;
  size_t i;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *local_30;
  ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *row;
  size_t local_20;
  size_t rowIndex_local;
  PaddedStringTable *this_local;
  string *s;
  
  row._7_1_ = 0;
  local_20 = rowIndex;
  rowIndex_local = (size_t)this;
  this_local = (PaddedStringTable *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = ArrayWithPreallocation<soul::ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>,_16UL>
             ::operator[](&this->rows,local_20);
  for (local_48 = 0; uVar1 = local_48,
      sVar3 = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
              ::size(local_30), uVar2 = local_48, uVar1 < sVar3; local_48 = local_48 + 1) {
    sVar3 = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::size(local_30);
    if (uVar2 < sVar3 - 1) {
      pbVar4 = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               ::operator[](local_30,local_48);
      puVar5 = ArrayWithPreallocation<unsigned_long,_16UL>::operator[](&this->columnWidths,local_48)
      ;
      padded(&local_68,pbVar4,(int)*puVar5 + this->numExtraSpaces);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      pbVar4 = ArrayWithPreallocation<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               ::operator[](local_30,local_48);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PaddedStringTable::getRow (size_t rowIndex) const
{
    std::string s;
    auto& row = rows[rowIndex];

    for (size_t i = 0; i < row.size(); ++i)
    {
        if (i < row.size() - 1)
            s += padded (row[i], (int) columnWidths[i] + numExtraSpaces);
        else
            s += row[i];
    }

    return s;
}